

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zBuf.c
# Opt level: O1

int Buf_Create(CBuf *p,size_t size,ISzAlloc *alloc)

{
  Byte *pBVar1;
  
  p->size = 0;
  if (size == 0) {
    p->data = (Byte *)0x0;
  }
  else {
    pBVar1 = (Byte *)(*alloc->Alloc)(alloc,size);
    p->data = pBVar1;
    if (pBVar1 == (Byte *)0x0) {
      return 0;
    }
    p->size = size;
  }
  return 1;
}

Assistant:

int Buf_Create(CBuf *p, size_t size, ISzAlloc *alloc)
{
  p->size = 0;
  if (size == 0)
  {
    p->data = 0;
    return 1;
  }
  p->data = (Byte *)alloc->Alloc(alloc, size);
  if (p->data != 0)
  {
    p->size = size;
    return 1;
  }
  return 0;
}